

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

double P_GetFriction(AActor *mo,double *frictionfactor)

{
  uint uVar1;
  player_t *ppVar2;
  F3DFloor *pFVar3;
  secplane_t *psVar4;
  sector_t *psVar5;
  extsector_t *peVar6;
  sector_t *psVar7;
  int iVar8;
  ulong uVar9;
  msecnode_t *pmVar10;
  double dVar11;
  double dVar12;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar13;
  double dVar14;
  double movefactor;
  double newmf;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double *local_38;
  
  local_70 = 0.03125;
  ppVar2 = mo->player;
  local_38 = frictionfactor;
  if (((ppVar2 == (player_t *)0x0) || (ppVar2->mo != (APlayerPawn *)mo)) ||
     ((ppVar2->cheats & 0x40000000) == 0)) {
    if ((((mo->flags2).Value & 0x10) == 0) || (((mo->flags).Value & 0x200) == 0)) {
      uVar1 = (mo->flags).Value;
      if ((((uVar1 >> 9 & 1) == 0) && (1 < mo->waterlevel)) ||
         ((mo->waterlevel == 1 && (mo->floorz + 6.0 < (mo->__Pos).Z)))) {
        local_68 = sector_t::GetFriction(mo->Sector,0,&local_70);
        local_70 = local_70 * 0.5;
        peVar6 = mo->Sector->e;
        if ((peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
          uVar9 = 0;
          do {
            pFVar3 = (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar9];
            if ((~pFVar3->flags & 0x11) == 0) {
              dVar11 = (mo->__Pos).Z;
              psVar4 = (pFVar3->top).plane;
              dVar14 = (mo->__Pos).X;
              dVar12 = (mo->__Pos).Y;
              if ((dVar11 <= ((psVar4->normal).Y * dVar12 + (psVar4->normal).X * dVar14 + psVar4->D)
                             * psVar4->negiC) &&
                 (psVar4 = (pFVar3->bottom).plane,
                 (dVar12 * (psVar4->normal).Y + dVar14 * (psVar4->normal).X + psVar4->D) *
                 psVar4->negiC <= dVar11)) {
                dVar11 = sector_t::GetFriction(pFVar3->model,(pFVar3->top).isceiling,&local_58);
                if (((local_68 == 0.90625) && (!NAN(local_68))) || (dVar11 < local_68)) {
                  local_70 = local_58 * 0.5;
                  local_68 = dVar11;
                }
              }
            }
            uVar9 = uVar9 + 1;
            peVar6 = mo->Sector->e;
          } while (uVar9 < (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
        }
      }
      else {
        local_68 = 0.90625;
        if ((((uVar1 & 0x1200) == 0) && (var_friction.Value)) &&
           (pmVar10 = mo->touching_sectorlist, pmVar10 != (msecnode_t *)0x0)) {
          local_68 = 0.90625;
          uStack_60 = 0;
          do {
            psVar5 = pmVar10->m_sector;
            iVar8 = mo->Sector->PortalGroup;
            dVar11 = 0.0;
            dVar14 = 0.0;
            if (iVar8 != psVar5->PortalGroup) {
              iVar8 = psVar5->PortalGroup * Displacements.size + iVar8;
              dVar11 = Displacements.data.Array[iVar8].pos.X;
              dVar14 = Displacements.data.Array[iVar8].pos.Y;
            }
            dVar11 = dVar11 + (mo->__Pos).X;
            dVar14 = dVar14 + (mo->__Pos).Y;
            peVar6 = psVar5->e;
            local_50 = dVar11;
            local_48 = dVar14;
            if ((peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
              uVar9 = 0;
              do {
                pFVar3 = (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar9];
                uVar1 = pFVar3->flags;
                if ((uVar1 & 1) != 0) {
                  if ((uVar1 & 2) == 0) {
                    if ((uVar1 & 0x10) != 0) {
                      psVar4 = (pFVar3->top).plane;
                      dVar12 = (mo->__Pos).Z;
                      if ((dVar12 <= ((psVar4->normal).Y * dVar14 +
                                     (psVar4->normal).X * dVar11 + psVar4->D) * psVar4->negiC) &&
                         (psVar4 = (pFVar3->bottom).plane,
                         ((psVar4->normal).Y * dVar14 + (psVar4->normal).X * dVar11 + psVar4->D) *
                         psVar4->negiC <= dVar12 + mo->Height)) goto LAB_0050c6b4;
                    }
                  }
                  else {
                    psVar4 = (pFVar3->top).plane;
                    if (ABS((mo->__Pos).Z -
                            ((psVar4->normal).Y * dVar14 + (psVar4->normal).X * dVar11 + psVar4->D)
                            * psVar4->negiC) < 1.52587890625e-05) {
LAB_0050c6b4:
                      dVar12 = sector_t::GetFriction
                                         (pFVar3->model,(pFVar3->top).isceiling,&local_58);
                      dVar14 = local_48;
                      dVar11 = local_50;
                      if (((local_68 == 0.90625) && (!NAN(local_68))) || (dVar12 < local_68)) {
                        local_70 = local_58;
                        local_68 = dVar12;
                        uStack_60 = extraout_XMM0_Qb;
                      }
                    }
                  }
                }
                uVar9 = uVar9 + 1;
                peVar6 = psVar5->e;
              } while (uVar9 < (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
            }
            if ((psVar5->Flags & 0x10) == 0) {
              iVar8 = sector_t::GetTerrain(psVar5,0);
              if ((Terrains.Array[iVar8].Friction != 0.0) || (NAN(Terrains.Array[iVar8].Friction)))
              goto LAB_0050c74e;
            }
            else {
LAB_0050c74e:
              dVar11 = sector_t::GetFriction(psVar5,0,&local_58);
              if (((local_68 == 0.90625) && (!NAN(local_68))) || (dVar11 < local_68)) {
                uVar13 = extraout_XMM0_Qb_00;
                if (((psVar5->floorplane).normal.Y * local_48 +
                    (psVar5->floorplane).normal.X * local_50 + (psVar5->floorplane).D) *
                    (psVar5->floorplane).negiC < (mo->__Pos).Z) {
                  local_40 = dVar11;
                  psVar7 = sector_t::GetHeightSec(psVar5);
                  if (psVar7 != (sector_t *)0x0) {
                    psVar5 = psVar5->heightsec;
                    uVar13 = 0;
                    dVar11 = local_40;
                    if ((mo->__Pos).Z <=
                        (local_48 * (psVar5->floorplane).normal.Y +
                        local_50 * (psVar5->floorplane).normal.X + (psVar5->floorplane).D) *
                        (psVar5->floorplane).negiC) goto LAB_0050c81a;
                  }
                }
                else {
LAB_0050c81a:
                  local_70 = local_58;
                  local_68 = dVar11;
                  uStack_60 = uVar13;
                }
              }
            }
            pmVar10 = pmVar10->m_tnext;
          } while (pmVar10 != (msecnode_t *)0x0);
        }
      }
    }
    else {
      local_68 = 0.91796875;
    }
  }
  else {
    local_68 = 0.90625;
  }
  dVar11 = mo->Friction;
  if ((dVar11 != 1.0) || (NAN(dVar11))) {
    local_68 = local_68 * dVar11;
    dVar11 = 1.0;
    if (local_68 <= 1.0) {
      dVar11 = local_68;
    }
    local_68 = (double)(-(ulong)(0.0 < local_68) & (ulong)dVar11);
    uStack_60 = 0;
    local_70 = FrictionToMoveFactor(local_68);
  }
  if (local_38 != (double *)0x0) {
    *local_38 = local_70;
  }
  return local_68;
}

Assistant:

double P_GetFriction(const AActor *mo, double *frictionfactor)
{
	double friction = ORIG_FRICTION;
	double movefactor = ORIG_FRICTION_FACTOR;
	double newfriction;
	double newmf;

	const msecnode_t *m;
	sector_t *sec;

	if (mo->IsNoClip2())
	{
		// The default values are fine for noclip2 mode
	}
	else if (mo->flags2 & MF2_FLY && mo->flags & MF_NOGRAVITY)
	{
		friction = FRICTION_FLY;
	}
	else if ((!(mo->flags & MF_NOGRAVITY) && mo->waterlevel > 1) ||
		(mo->waterlevel == 1 && mo->Z() > mo->floorz+ 6))
	{
		friction = mo->Sector->GetFriction(sector_t::floor, &movefactor);
		movefactor *= 0.5;

		// Check 3D floors -- might be the source of the waterlevel
		for (unsigned i = 0; i < mo->Sector->e->XFloor.ffloors.Size(); i++)
		{
			F3DFloor *rover = mo->Sector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;
			if (!(rover->flags & FF_SWIMMABLE)) continue;

			if (mo->Z() > rover->top.plane->ZatPoint(mo) ||
				mo->Z() < rover->bottom.plane->ZatPoint(mo))
				continue;

			newfriction = rover->model->GetFriction(rover->top.isceiling, &newmf);
			if (newfriction < friction || friction == ORIG_FRICTION)
			{
				friction = newfriction;
				movefactor = newmf * 0.5;
			}
		}
	}
	else if (var_friction && !(mo->flags & (MF_NOCLIP | MF_NOGRAVITY)))
	{	// When the object is straddling sectors with the same
		// floor height that have different frictions, use the lowest
		// friction value (muddy has precedence over icy).

		for (m = mo->touching_sectorlist; m; m = m->m_tnext)
		{
			sec = m->m_sector;
			DVector3 pos = mo->PosRelative(sec);

			// 3D floors must be checked, too
			for (unsigned i = 0; i < sec->e->XFloor.ffloors.Size(); i++)
			{
				F3DFloor *rover = sec->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;

				if (rover->flags & FF_SOLID)
				{
					// Must be standing on a solid floor
					if (!mo->isAtZ(rover->top.plane->ZatPoint(pos))) continue;
				}
				else if (rover->flags & FF_SWIMMABLE)
				{
					// Or on or inside a swimmable floor (e.g. in shallow water)
					if (mo->Z() > rover->top.plane->ZatPoint(pos) ||
						(mo->Top()) < rover->bottom.plane->ZatPoint(pos))
						continue;
				}
				else
					continue;

				newfriction = rover->model->GetFriction(rover->top.isceiling, &newmf);
				if (newfriction < friction || friction == ORIG_FRICTION)
				{
					friction = newfriction;
					movefactor = newmf;
				}
			}

			if (!(sec->Flags & SECF_FRICTION) &&
				Terrains[sec->GetTerrain(sector_t::floor)].Friction == 0)
			{
				continue;
			}
			newfriction = sec->GetFriction(sector_t::floor, &newmf);
			if ((newfriction < friction || friction == ORIG_FRICTION) &&
				(mo->Z() <= sec->floorplane.ZatPoint(pos) ||
				(sec->GetHeightSec() != NULL &&
				mo->Z() <= sec->heightsec->floorplane.ZatPoint(pos))))
			{
				friction = newfriction;
				movefactor = newmf;
			}
		}
	}

	if (mo->Friction != 1)
	{
		friction = clamp((friction * mo->Friction), 0., 1.);
		movefactor = FrictionToMoveFactor(friction);
	}

	if (frictionfactor)
		*frictionfactor = movefactor;

	return friction;
}